

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMaterialShellReissner::ChMaterialShellReissner
          (ChMaterialShellReissner *this,shared_ptr<chrono::fea::ChElasticityReissner> *melasticity,
          shared_ptr<chrono::fea::ChPlasticityReissner> *mplasticity,
          shared_ptr<chrono::fea::ChDampingReissner> *mdamping)

{
  __shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this->_vptr_ChMaterialShellReissner = (_func_int **)&PTR__ChMaterialShellReissner_01177868;
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->damping).super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->damping).super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &melasticity->
              super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>);
  SetElasticity(this,(shared_ptr<chrono::fea::ChElasticityReissner> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if ((mplasticity->
      super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &mplasticity->
                super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>);
    SetPlasticity(this,(shared_ptr<chrono::fea::ChPlasticityReissner> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  if ((mdamping->super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    std::__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &mdamping->
                super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>);
    SetDamping(this,(shared_ptr<chrono::fea::ChDampingReissner> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return;
}

Assistant:

ChMaterialShellReissner::ChMaterialShellReissner(std::shared_ptr<ChElasticityReissner> melasticity,
											   std::shared_ptr<ChPlasticityReissner> mplasticity,
											   std::shared_ptr<ChDampingReissner>    mdamping) {
    this->SetElasticity(melasticity);

    if (mplasticity)
        this->SetPlasticity(mplasticity);

    if (mdamping)
        this->SetDamping(mdamping);
}